

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool __thiscall bloaty::ArgParser::TryParseIntegerOption(ArgParser *this,string_view flag,int *val)

{
  bool bVar1;
  bool bVar2;
  string_view *out;
  Arg *in_R9;
  string_view str;
  string_view format;
  string_view val_str;
  string local_a0;
  Arg local_80;
  size_t local_50;
  char *local_48;
  
  out = &val_str;
  val_str._M_len = 0;
  val_str._M_str = (char *)0x0;
  bVar1 = TryParseOption(this,flag,&val_str);
  if (bVar1) {
    str._M_str = (char *)val;
    str._M_len = (size_t)val_str._M_str;
    bVar2 = absl::SimpleAtoi<int>((absl *)val_str._M_len,str,(Nonnull<int_*>)out);
    if (!bVar2) {
      local_80.piece_._M_len = val_str._M_len;
      local_80.piece_._M_str = val_str._M_str;
      format._M_str = (char *)&local_50;
      format._M_len = (size_t)"option \'$0\' had non-integral argument: $1";
      local_50 = flag._M_len;
      local_48 = flag._M_str;
      absl::Substitute_abi_cxx11_(&local_a0,(absl *)0x29,format,&local_80,in_R9);
      Throw(local_a0._M_dataplus._M_p,0x827);
    }
  }
  return bVar1;
}

Assistant:

bool TryParseIntegerOption(string_view flag, int* val) {
    string_view val_str;
    if (!TryParseOption(flag, &val_str)) {
      return false;
    }

    if (!absl::SimpleAtoi(val_str, val)) {
      THROWF("option '$0' had non-integral argument: $1", flag, val_str);
    }

    return true;
  }